

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O0

void __thiscall TPZPrInteg<TPZIntTriang>::GetOrder(TPZPrInteg<TPZIntTriang> *this,TPZVec<int> *ord)

{
  int64_t iVar1;
  int *piVar2;
  TPZVec<int> *in_RSI;
  long in_RDI;
  TPZVec<int> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  iVar1 = TPZVec<int>::NElements(in_RSI);
  if (iVar1 < 3) {
    std::operator<<((ostream *)&std::cout,
                    "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
                   );
  }
  else {
    TPZIntTriang::GetOrder
              ((TPZIntTriang *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
    iVar3 = *(int *)(in_RDI + 0x18);
    piVar2 = TPZVec<int>::operator[](in_RSI,2);
    *piVar2 = iVar3;
  }
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }